

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O2

ZSTD_DCtx * ZSTD_createDCtx_internal(ZSTD_customMem customMem)

{
  ZSTD_customMem customMem_00;
  ZSTD_DCtx *dctx;
  ZSTD_allocFunction in_stack_00000008;
  ZSTD_freeFunction in_stack_00000010;
  void *in_stack_00000018;
  
  if (((in_stack_00000010 == (ZSTD_freeFunction)0x0) ==
       (in_stack_00000008 == (ZSTD_allocFunction)0x0)) &&
     (customMem_00.customFree = in_stack_00000010, customMem_00.customAlloc = in_stack_00000008,
     customMem_00.opaque = in_stack_00000018,
     dctx = (ZSTD_DCtx *)ZSTD_customMalloc(0x176e0,customMem_00), dctx != (ZSTD_DCtx *)0x0)) {
    (dctx->customMem).opaque = in_stack_00000018;
    (dctx->customMem).customAlloc = in_stack_00000008;
    (dctx->customMem).customFree = in_stack_00000010;
    ZSTD_initDCtx_internal(dctx);
    return dctx;
  }
  return (ZSTD_DCtx *)0x0;
}

Assistant:

static ZSTD_DCtx* ZSTD_createDCtx_internal(ZSTD_customMem customMem) {
    if ((!customMem.customAlloc) ^ (!customMem.customFree)) return NULL;

    {   ZSTD_DCtx* const dctx = (ZSTD_DCtx*)ZSTD_customMalloc(sizeof(*dctx), customMem);
        if (!dctx) return NULL;
        dctx->customMem = customMem;
        ZSTD_initDCtx_internal(dctx);
        return dctx;
    }
}